

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_>::Write
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_> *this,TPZStream *buf,
          int withclassid)

{
  uint in_EDX;
  TPZGeoBlend<pzgeom::TPZGeoPoint> *in_RSI;
  TPZStream *in_RDI;
  TPZGeoEl *unaff_retaddr;
  uint i;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar1;
  
  TPZGeoEl::Write(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20));
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>::Write
            (in_RSI,(TPZStream *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
             (int)((ulong)in_RDI >> 0x20));
  for (iVar1 = 0; iVar1 == 0; iVar1 = iVar1 + 1) {
    (*in_RDI[0x42]._vptr_TPZStream[5])(in_RDI + 0x42,in_RSI,(ulong)in_EDX);
  }
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::Write(TPZStream &buf, int withclassid) const {
    TPZGeoEl::Write(buf, withclassid);
    fGeo.Write(buf, withclassid);
    for (unsigned int i = 0; i < TGeo::NSides; ++i) {
        this->fNeighbours[i].Write(buf, withclassid);
    }
}